

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O0

void __thiscall
primecount::Vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
          (Vector<unsigned_long,_std::allocator<unsigned_long>_> *this,size_t n)

{
  size_t sVar1;
  ulong in_RSI;
  Vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t in_stack_00000008;
  Vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000010;
  
  sVar1 = size(in_RDI);
  if (sVar1 < in_RSI) {
    sVar1 = capacity(in_RDI);
    if (sVar1 < in_RSI) {
      reserve_unchecked(in_stack_00000010,in_stack_00000008);
    }
    in_RDI->end_ = in_RDI->array_ + in_RSI;
  }
  else {
    sVar1 = size(in_RDI);
    if (in_RSI < sVar1) {
      in_RDI->end_ = in_RDI->array_ + in_RSI;
    }
  }
  return;
}

Assistant:

void resize(std::size_t n)
  {
    if (n > size())
    {
      if (n > capacity())
        reserve_unchecked(n);

      // This default initializes memory of classes and structs
      // with constructors (and with in-class initialization of
      // non-static members). But it does not default initialize
      // memory for POD types like int, long.
      if (!std::is_trivial<T>::value)
        uninitialized_default_construct(end_, array_ + n);

      end_ = array_ + n;
    }
    else if (n < size())
    {
      destroy(array_ + n, end_);
      end_ = array_ + n;
    }
  }